

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastInlineStringCharCodeAt(Lowerer *this,Instr *instr,BuiltinFunction index)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  LabelInstr *doneLabel;
  LabelInstr *labelHelper;
  Lowerer *this_00;
  Instr *in_R9;
  Opnd *pOStack_48;
  Opnd *argsOpnd [2];
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x524e,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar3) goto LAB_0054bf7d;
    *puVar4 = 0;
  }
  pSVar5 = IR::Opnd::AsSymOpnd(instr->m_src2);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  pIVar1 = (pSVar6->field_5).m_instrDef;
  pOStack_48 = (Opnd *)0x0;
  argsOpnd[0] = (Opnd *)0x0;
  bVar3 = IR::Instr::FetchOperands(instr,&pOStack_48,2);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5257,"(result)","result");
    if (!bVar3) {
LAB_0054bf7d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  argsOpnd[1] = (Opnd *)pIVar1;
  doneLabel = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instr,&doneLabel->super_Instr);
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  bVar3 = GenerateFastCharAt(this,index,instr->m_dst,pOStack_48,argsOpnd[0],in_R9,instr,labelHelper,
                             doneLabel);
  IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
  if (bVar3) {
    this_00 = (Lowerer *)0x9;
    InsertBranch(Br,true,doneLabel,&labelHelper->super_Instr);
    RelocateCallDirectToHelperPath(this_00,(Instr *)argsOpnd[1],labelHelper);
  }
  return bVar3;
}

Assistant:

bool
Lowerer::GenerateFastInlineStringCharCodeAt(IR::Instr * instr, Js::BuiltinFunction index)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = {0};
    bool result  = instr->FetchOperands(argsOpnd, 2);
    Assert(result);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr->InsertAfter(doneLabel);

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    bool success = GenerateFastCharAt(index, instr->GetDst(), argsOpnd[0], argsOpnd[1],
            instr, instr, labelHelper, doneLabel);

    instr->InsertBefore(labelHelper);
    if (!success)
    {
        return false;
    }

    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);

    return true;
}